

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O3

int duckdb_hll::hllSparseSet(robj *o,long index,uint8_t count)

{
  void *pvVar1;
  byte bVar2;
  int iVar3;
  unsigned_long _fb8;
  sds s;
  byte bVar4;
  byte *pbVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  size_t __n;
  byte *pbVar16;
  byte *pbVar17;
  byte *pbVar18;
  uint8_t seq [5];
  byte local_45 [5];
  undefined8 local_40;
  byte *local_38;
  
  local_40 = CONCAT71(in_register_00000011,count);
  if (count < 0x21) {
    s = sdsMakeRoomFor((sds)o->ptr,3);
    o->ptr = s;
    switch(s[-1] & 7) {
    case 0:
      uVar6 = (ulong)((byte)s[-1] >> 3);
      break;
    case 1:
      uVar6 = (ulong)(byte)s[-4];
      break;
    case 2:
      uVar6 = (ulong)*(ushort *)(s + -6);
      break;
    case 3:
      uVar6 = (ulong)*(uint *)(s + -10);
      break;
    case 4:
      uVar6 = *(ulong *)(s + -0x12);
      break;
    default:
      return -1;
    }
    if ((long)uVar6 < 0x12) {
      return -1;
    }
    pbVar17 = (byte *)(s + 0x11);
    pbVar7 = (byte *)(s + uVar6);
    lVar15 = 0;
    pbVar16 = pbVar17;
    pbVar18 = (byte *)0x0;
    do {
      pbVar8 = pbVar16;
      bVar11 = *pbVar8;
      lVar10 = 1;
      uVar9 = (uint)bVar11;
      if (0x3f < bVar11) {
        if ((char)bVar11 < '\0') {
          uVar9 = bVar11 & 3;
        }
        else {
          uVar9 = (uint)pbVar8[1] | (uVar9 & 0x3f) << 8;
          lVar10 = 2;
        }
      }
      lVar14 = (ulong)uVar9 + lVar15 + 1;
      pbVar16 = pbVar8;
      if (index < lVar14) goto LAB_01cc6ad7;
      pbVar16 = pbVar8 + lVar10;
      lVar15 = lVar14;
      pbVar18 = pbVar8;
    } while (pbVar16 < pbVar7);
    bVar11 = *pbVar16;
LAB_01cc6ad7:
    pbVar5 = pbVar16 + (ulong)((bVar11 & 0xc0) == 0x40) + 1;
    pbVar8 = (byte *)0x0;
    if (pbVar5 < pbVar7) {
      pbVar8 = pbVar5;
    }
    if ((bVar11 & 0xc0) == 0) {
      if (bVar11 != 0) goto LAB_01cc6b45;
LAB_01cc6b7a:
      *pbVar16 = (byte)local_40 * '\x04' + 0x7c | 0x80;
    }
    else {
      if ((bVar11 & 0xc0) == 0x40) {
LAB_01cc6b45:
        iVar3 = uVar9 + (int)lVar15;
        lVar15 = index - lVar15;
        if (lVar15 == 0) {
          local_38 = local_45;
        }
        else if ((int)lVar15 < 0x41) {
          local_45[0] = (char)lVar15 - 1;
          local_38 = local_45 + 1;
        }
        else {
          iVar13 = (int)lVar15 + -1;
          local_45[0] = (byte)((uint)iVar13 >> 8) | 0x40;
          local_38 = local_45 + 2;
          local_45[1] = (byte)iVar13;
        }
        *local_38 = (byte)local_40 * '\x04' + 0x7c | 0x80;
        if (iVar3 == index) {
          local_38 = local_38 + (1 - (long)local_45);
        }
        else {
          iVar3 = iVar3 - (int)index;
          if (iVar3 < 0x41) {
            local_38[1] = (char)iVar3 - 1;
            local_38 = local_38 + (2 - (long)local_45);
          }
          else {
            local_38[1] = (byte)((uint)(iVar3 + -1) >> 8) | 0x40;
            local_38[2] = (byte)(iVar3 + -1);
            local_38 = local_38 + (3 - (long)local_45);
          }
        }
        if ((bVar11 & 0xc0) == 0) goto LAB_01cc6c80;
        iVar3 = -2;
      }
      else {
        bVar12 = bVar11 >> 2 & 0x1f;
        if ((byte)local_40 <= (byte)(bVar12 + 1)) {
          return 0;
        }
        if ((bVar11 & 3) == 0) goto LAB_01cc6b7a;
        iVar3 = uVar9 + (int)lVar15;
        if (index == lVar15) {
          local_38 = local_45;
        }
        else {
          local_45[0] = ((byte)index - (char)lVar15) - 1 | bVar12 * '\x04' | 0x80;
          local_38 = local_45 + 1;
        }
        *local_38 = (byte)local_40 * '\x04' + 0x7c | 0x80;
        if (iVar3 == index) {
          local_38 = local_38 + 1;
        }
        else {
          local_38[1] = (char)iVar3 + ~(byte)index | bVar12 << 2 | 0x80;
          local_38 = local_38 + 2;
        }
        local_38 = local_38 + -(long)local_45;
LAB_01cc6c80:
        iVar3 = -1;
      }
      uVar9 = (int)local_38 + iVar3;
      if (0 < (int)uVar9) {
        switch(s[-1] & 7) {
        case 0:
          uVar6 = (ulong)((byte)s[-1] >> 3);
          break;
        case 1:
          uVar6 = (ulong)(byte)s[-4];
          break;
        case 2:
          uVar6 = (ulong)*(ushort *)(s + -6);
          break;
        case 3:
          uVar6 = (ulong)*(uint *)(s + -10);
          break;
        case 4:
          uVar6 = *(ulong *)(s + -0x12);
          break;
        default:
          uVar6 = 0;
        }
        if (3000 < uVar9 + uVar6) goto LAB_01cc6953;
      }
      lVar15 = (long)(int)uVar9;
      if ((uVar9 != 0) && (pbVar5 < pbVar7)) {
        memmove(pbVar8 + lVar15,pbVar8,(long)pbVar7 - (long)pbVar8);
        s = (sds)o->ptr;
      }
      sdsIncrLen(s,lVar15);
      switchD_015df945::default(pbVar16,local_45,(long)(int)local_38);
      pbVar7 = pbVar7 + lVar15;
    }
    if (pbVar18 != (byte *)0x0) {
      pbVar17 = pbVar18;
    }
    if (pbVar17 < pbVar7) {
      iVar3 = 5;
      while (iVar3 != 0) {
        pbVar16 = pbVar17 + 1;
        iVar3 = 1 - iVar3;
        __n = (long)pbVar7 - (long)pbVar17;
        while( true ) {
          bVar11 = *pbVar17;
          if ((bVar11 & 0xc0) == 0) break;
          if ((bVar11 & 0xc0) == 0x40) {
            pbVar16 = pbVar17 + 2;
            break;
          }
          if ((((pbVar7 <= pbVar16) || (bVar12 = *pbVar16, -1 < (char)bVar12)) ||
              (((bVar12 ^ bVar11) & 0x7c) != 0)) ||
             (bVar12 = (bVar12 & 3) + (bVar11 & 3), 2 < bVar12)) break;
          pbVar17[1] = bVar12 + 1 | bVar11 & 0x7c | 0x80;
          memmove(pbVar17,pbVar16,__n);
          sdsIncrLen((sds)o->ptr,-1);
          pbVar7 = pbVar7 + -1;
          iVar3 = iVar3 + 1;
          __n = __n - 1;
          if (iVar3 == 1) goto LAB_01cc6de2;
        }
        pbVar17 = pbVar16;
        iVar3 = -iVar3;
        if (pbVar7 <= pbVar17) break;
      }
    }
LAB_01cc6de2:
    pbVar17 = (byte *)((long)o->ptr + 0xf);
    *pbVar17 = *pbVar17 | 0x80;
  }
  else {
LAB_01cc6953:
    iVar3 = hllSparseToDense(o);
    if (iVar3 == -1) {
      return -1;
    }
    pvVar1 = o->ptr;
    lVar15 = index * 6;
    lVar10 = index * 6 + 7;
    if (-1 < lVar15) {
      lVar10 = lVar15;
    }
    lVar10 = lVar10 >> 3;
    bVar2 = (byte)lVar15 & 6;
    bVar4 = 8 - bVar2;
    bVar11 = *(byte *)((long)pvVar1 + lVar10 + 0x11);
    bVar12 = *(byte *)((long)pvVar1 + lVar10 + 0x12);
    if ((uint)(byte)local_40 <= (((uint)(bVar11 >> bVar2) | (uint)bVar12 << (bVar4 & 0x1f)) & 0x3f))
    {
      return 0;
    }
    *(byte *)((long)pvVar1 + lVar10 + 0x11) = (byte)local_40 << bVar2 | ~('?' << bVar2) & bVar11;
    *(byte *)((long)pvVar1 + lVar10 + 0x12) =
         (byte)local_40 >> (bVar4 & 0x3f) | (byte)(-0x40 >> (bVar4 & 0x1f)) & bVar12;
  }
  return 1;
}

Assistant:

int hllSparseSet(robj *o, long index, uint8_t count) {
    struct hllhdr *hdr;
    uint8_t oldcount, *sparse, *end, *p, *prev, *next;
    long first, span;
    long is_zero = 0, is_xzero = 0, is_val = 0, runlen = 0;
    uint8_t seq[5], *n;
    int last;
    int len;
    int seqlen;
    int oldlen;
    int deltalen;

    /* If the count is too big to be representable by the sparse representation
     * switch to dense representation. */
    if (count > HLL_SPARSE_VAL_MAX_VALUE) goto promote;

    /* When updating a sparse representation, sometimes we may need to
     * enlarge the buffer for up to 3 bytes in the worst case (XZERO split
     * into XZERO-VAL-XZERO). Make sure there is enough space right now
     * so that the pointers we take during the execution of the function
     * will be valid all the time. */
    o->ptr = (sds) sdsMakeRoomFor((sds) o->ptr,3);

    /* Step 1: we need to locate the opcode we need to modify to check
     * if a value update is actually needed. */
    sparse = p = ((uint8_t*)o->ptr) + HLL_HDR_SIZE;
    end = p + sdslen((sds) o->ptr) - HLL_HDR_SIZE;

    first = 0;
    prev = NULL; /* Points to previous opcode at the end of the loop. */
    next = NULL; /* Points to the next opcode at the end of the loop. */
    span = 0;
    while(p < end) {
        long oplen;

        /* Set span to the number of registers covered by this opcode.
         *
         * This is the most performance critical loop of the sparse
         * representation. Sorting the conditionals from the most to the
         * least frequent opcode in many-bytes sparse HLLs is faster. */
        oplen = 1;
        if (HLL_SPARSE_IS_ZERO(p)) {
            span = HLL_SPARSE_ZERO_LEN(p);
        } else if (HLL_SPARSE_IS_VAL(p)) {
            span = HLL_SPARSE_VAL_LEN(p);
        } else { /* XZERO. */
            span = HLL_SPARSE_XZERO_LEN(p);
            oplen = 2;
        }
        /* Break if this opcode covers the register as 'index'. */
        if (index <= first+span-1) break;
        prev = p;
        p += oplen;
        first += span;
    }
    if (span == 0) return -1; /* Invalid format. */

    next = HLL_SPARSE_IS_XZERO(p) ? p+2 : p+1;
    if (next >= end) next = NULL;

    /* Cache current opcode type to avoid using the macro again and
     * again for something that will not change.
     * Also cache the run-length of the opcode. */
    if (HLL_SPARSE_IS_ZERO(p)) {
        is_zero = 1;
        runlen = HLL_SPARSE_ZERO_LEN(p);
    } else if (HLL_SPARSE_IS_XZERO(p)) {
        is_xzero = 1;
        runlen = HLL_SPARSE_XZERO_LEN(p);
    } else {
        is_val = 1;
        runlen = HLL_SPARSE_VAL_LEN(p);
    }

    /* Step 2: After the loop:
     *
     * 'first' stores to the index of the first register covered
     *  by the current opcode, which is pointed by 'p'.
     *
     * 'next' ad 'prev' store respectively the next and previous opcode,
     *  or NULL if the opcode at 'p' is respectively the last or first.
     *
     * 'span' is set to the number of registers covered by the current
     *  opcode.
     *
     * There are different cases in order to update the data structure
     * in place without generating it from scratch:
     *
     * A) If it is a VAL opcode already set to a value >= our 'count'
     *    no update is needed, regardless of the VAL run-length field.
     *    In this case PFADD returns 0 since no changes are performed.
     *
     * B) If it is a VAL opcode with len = 1 (representing only our
     *    register) and the value is less than 'count', we just update it
     *    since this is a trivial case. */
    if (is_val) {
        oldcount = HLL_SPARSE_VAL_VALUE(p);
        /* Case A. */
        if (oldcount >= count) return 0;

        /* Case B. */
        if (runlen == 1) {
            HLL_SPARSE_VAL_SET(p,count,1);
            goto updated;
        }
    }

    /* C) Another trivial to handle case is a ZERO opcode with a len of 1.
     * We can just replace it with a VAL opcode with our value and len of 1. */
    if (is_zero && runlen == 1) {
        HLL_SPARSE_VAL_SET(p,count,1);
        goto updated;
    }

    /* D) General case.
     *
     * The other cases are more complex: our register requires to be updated
     * and is either currently represented by a VAL opcode with len > 1,
     * by a ZERO opcode with len > 1, or by an XZERO opcode.
     *
     * In those cases the original opcode must be split into multiple
     * opcodes. The worst case is an XZERO split in the middle resuling into
     * XZERO - VAL - XZERO, so the resulting sequence max length is
     * 5 bytes.
     *
     * We perform the split writing the new sequence into the 'new' buffer
     * with 'newlen' as length. Later the new sequence is inserted in place
     * of the old one, possibly moving what is on the right a few bytes
     * if the new sequence is longer than the older one. */
    n = seq;
    last = first+span-1; /* Last register covered by the sequence. */

    if (is_zero || is_xzero) {
        /* Handle splitting of ZERO / XZERO. */
        if (index != first) {
            len = index-first;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
    } else {
        /* Handle splitting of VAL. */
        int curval = HLL_SPARSE_VAL_VALUE(p);

        if (index != first) {
            len = index-first;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
    }

    /* Step 3: substitute the new sequence with the old one.
     *
     * Note that we already allocated space on the sds string
     * calling sdsMakeRoomFor(). */
     seqlen = n-seq;
     oldlen = is_xzero ? 2 : 1;
     deltalen = seqlen-oldlen;

     if (deltalen > 0 &&
         sdslen((sds) o->ptr)+deltalen > HLL_SPARSE_MAX_BYTES) goto promote;
     if (deltalen && next) memmove(next+deltalen,next,end-next);
     sdsIncrLen((sds) o->ptr,deltalen);
     memcpy(p,seq,seqlen);
     end += deltalen;

updated: {
    /* Step 4: Merge adjacent values if possible.
     *
     * The representation was updated, however the resulting representation
     * may not be optimal: adjacent VAL opcodes can sometimes be merged into
     * a single one. */
    p = prev ? prev : sparse;
    int scanlen = 5; /* Scan up to 5 upcodes starting from prev. */
    while (p < end && scanlen--) {
        if (HLL_SPARSE_IS_XZERO(p)) {
            p += 2;
            continue;
        } else if (HLL_SPARSE_IS_ZERO(p)) {
            p++;
            continue;
        }
        /* We need two adjacent VAL opcodes to try a merge, having
         * the same value, and a len that fits the VAL opcode max len. */
        if (p+1 < end && HLL_SPARSE_IS_VAL(p+1)) {
            int v1 = HLL_SPARSE_VAL_VALUE(p);
            int v2 = HLL_SPARSE_VAL_VALUE(p+1);
            if (v1 == v2) {
                int len = HLL_SPARSE_VAL_LEN(p)+HLL_SPARSE_VAL_LEN(p+1);
                if (len <= HLL_SPARSE_VAL_MAX_LEN) {
                    HLL_SPARSE_VAL_SET(p+1,v1,len);
                    memmove(p,p+1,end-p);
                    sdsIncrLen((sds) o->ptr,-1);
                    end--;
                    /* After a merge we reiterate without incrementing 'p'
                     * in order to try to merge the just merged value with
                     * a value on its right. */
                    continue;
                }
            }
        }
        p++;
    }

    /* Invalidate the cached cardinality. */
    hdr = (struct hllhdr *) o->ptr;
    HLL_INVALIDATE_CACHE(hdr);
    return 1;
}
promote: /* Promote to dense representation. */
    if (hllSparseToDense(o) == HLL_C_ERR) return -1; /* Corrupted HLL. */
    hdr = (struct hllhdr *) o->ptr;

    /* We need to call hllDenseAdd() to perform the operation after the
     * conversion. However the result must be 1, since if we need to
     * convert from sparse to dense a register requires to be updated.
     *
     * Note that this in turn means that PFADD will make sure the command
     * is propagated to slaves / AOF, so if there is a sparse -> dense
     * conversion, it will be performed in all the slaves as well. */
    int dense_retval = hllDenseSet(hdr->registers + 1,index,count);
    assert(dense_retval == 1);
    return dense_retval;
}